

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSpaceTest.cpp
# Opt level: O2

void __thiscall RandomRealPointConstructor::test_method(RandomRealPointConstructor *this)

{
  undefined4 local_274;
  undefined1 local_270;
  char *local_268;
  shared_count sStack_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined **local_238;
  undefined1 local_230;
  undefined8 *local_228;
  char **local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  RealSpace R3;
  Point y;
  
  mnf::RealSpace::RealSpace(&R3,3);
  mnf::Manifold::createRandomPoint(1.0);
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d8,0x42);
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_0013ab88;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = (char **)0x12a264;
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
  ;
  local_240 = "";
  mnf::SubPoint::value();
  local_258 = local_268;
  local_274 = 3;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&local_238,&local_248,0x42,1,2,&local_258,"y.value().size()",&local_274,"3");
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f8,0x43);
  local_270 = mnf::Point::isInM(1e-12);
  local_268 = (char *)0x0;
  sStack_260.pi_ = (sp_counted_base *)0x0;
  local_258 = "y.isInM()";
  local_250 = "";
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_0013ac98;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
  ;
  local_210 = "";
  local_220 = &local_258;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_260);
  mnf::Point::~Point(&y);
  mnf::RealSpace::~RealSpace(&R3);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(RandomRealPointConstructor)
{
  RealSpace R3(3);
  Point y = R3.createRandomPoint();
  BOOST_CHECK_EQUAL(y.value().size(), 3);
  BOOST_CHECK(y.isInM());
}